

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::encode_pawn_pushes<(Movetype)12>(Movegen *this,U64 *b,int *dir)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = *b;
  while (uVar3 != 0) {
    lVar2 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar3 = uVar3 & uVar3 - 1;
    *b = uVar3;
    iVar1 = this->last;
    this->last = iVar1 + 1;
    this->list[iVar1].f = (char)*dir + (U8)lVar2;
    this->list[iVar1].t = (U8)lVar2;
    this->list[iVar1].type = '\f';
  }
  return;
}

Assistant:

inline void Movegen::encode_pawn_pushes(U64& b, const int& dir) {
	while (b) {
		int to = bits::pop_lsb(b);
		list[last++].set(to + dir, to, mt);
	}
}